

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.hpp
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> *
alphabet_mapping_tbl<unsigned_long>
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *global_hist)

{
  pointer puVar1;
  pointer puVar2;
  ulong in_RAX;
  unsigned_short uVar3;
  long lVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffff;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (__return_storage_ptr__,0x100,(value_type_conflict2 *)((long)&uStack_18 + 6),
             (allocator_type *)((long)&uStack_18 + 5));
  puVar1 = (global_hist->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 1;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    if (puVar1[lVar4] != 0) {
      puVar2[lVar4] = uVar3;
      uVar3 = uVar3 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> alphabet_mapping_tbl(const std::vector<index_t>& global_hist) {
    std::vector<uint16_t> mapping(256, 0);

    uint16_t next = static_cast<uint16_t>(1);
    for (std::size_t c = 0; c < 256; ++c) {
        if (global_hist[c] != 0) {
            mapping[c] = next;
            ++next;
        }
    }
    return mapping;
}